

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchmittTrigger.cpp
# Opt level: O3

void __thiscall
iDynTree::SchmittTrigger::updateDevice(SchmittTrigger *this,double currentTime,double rawValue)

{
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  double dVar4;
  
  if (this->m_previousTime <= 0.0 && this->m_previousTime != 0.0) {
    dVar4 = 0.0;
    if (currentTime <= 0.0) {
      dVar4 = currentTime;
    }
    this->m_previousTime = dVar4;
  }
  if (this->m_verbose == 0) {
    this->m_rawValue = rawValue;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"SchmittTrigger: Time:: ",0x17);
    poVar1 = std::ostream::_M_insert<double>(currentTime);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    this->m_rawValue = rawValue;
    if (this->m_verbose != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"SchmittTrigger: Value:: ",0x18);
      poVar1 = std::ostream::_M_insert<double>(this->m_rawValue);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      if (this->m_verbose != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"SchmittTrigger: Timer:: ",0x18);
        poVar1 = std::ostream::_M_insert<double>(this->m_timer);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
        std::ostream::put((char)poVar1);
        std::ostream::flush();
      }
    }
  }
  if (this->m_currentState == false) {
    if (this->m_highValueThreshold <= this->m_rawValue) {
      dVar4 = this->m_timer;
      if (dVar4 < this->m_stableONTime || dVar4 == this->m_stableONTime) {
        this->m_timer = dVar4 + (currentTime - this->m_previousTime);
        if (this->m_verbose == 0) goto LAB_001516a7;
        pcVar3 = "SchmittTrigger: I\'m low and waiting ";
        lVar2 = 0x24;
      }
      else {
        this->m_currentState = true;
        if (this->m_verbose == 0) goto LAB_001516a7;
        pcVar3 = "SchmittTrigger: Raising high ";
        lVar2 = 0x1d;
      }
    }
    else {
      this->m_timer = 0.0;
      if (this->m_verbose == 0) goto LAB_001516a7;
      pcVar3 = "SchmittTrigger: Stable low ";
      lVar2 = 0x1b;
    }
  }
  else {
    if (this->m_rawValue <= this->m_lowValueThreshold) {
      dVar4 = this->m_timer;
      if (dVar4 < this->m_stableOFFTime || dVar4 == this->m_stableOFFTime) {
        this->m_timer = dVar4 + (currentTime - this->m_previousTime);
        if (this->m_verbose == 0) goto LAB_001516a7;
        pcVar3 = "SchmittTrigger: I\'m high and waiting ";
        lVar2 = 0x25;
        goto LAB_00151674;
      }
      this->m_currentState = false;
      if (this->m_verbose == 0) goto LAB_001516a7;
      pcVar3 = "SchmittTrigger: Falling low ";
    }
    else {
      this->m_timer = 0.0;
      if (this->m_verbose == 0) goto LAB_001516a7;
      pcVar3 = "SchmittTrigger: Stable high ";
    }
    lVar2 = 0x1c;
  }
LAB_00151674:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,lVar2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
LAB_001516a7:
  this->m_previousTime = currentTime;
  return;
}

Assistant:

void SchmittTrigger::updateDevice(double currentTime, double rawValue)
{
    if (m_previousTime < 0)
    {
        if (currentTime > 0)
        {
            m_previousTime = 0;
        }
        else
        {
            m_previousTime = currentTime;
        }   
    }
    if (m_verbose) std::cout << "SchmittTrigger: Time:: " << currentTime << std::endl;
    m_rawValue = rawValue;
    
    if (m_verbose) std::cout << "SchmittTrigger: Value:: " << m_rawValue << std::endl;
    if (m_verbose) std::cout << "SchmittTrigger: Timer:: " << m_timer << std::endl;
    
    if (m_currentState == false)
    {   
        // Check for transition - if valid over a timeframe, then switch
        if (m_rawValue >= m_highValueThreshold)
        {               
            if (m_timer > m_stableONTime)
            {
                // rise to high
                m_currentState = true;
                if (m_verbose) std::cout << "SchmittTrigger: Raising high "  << std::endl;
            }
            else
            {
                // wait for timer
                m_timer += (currentTime - m_previousTime);
                if (m_verbose) std::cout << "SchmittTrigger: I'm low and waiting "  << std::endl;
            }            
        }
        else
        {
            // stable low - reset timer
            m_timer = 0;
            if (m_verbose) std::cout << "SchmittTrigger: Stable low "  << std::endl;
        }
    }
    else
    {
        // check for transition - if valid over a timeframe, then switch
        if (m_rawValue <= m_lowValueThreshold)
        {
            if (m_timer > m_stableOFFTime)
            {
                // fall to low
                m_currentState = false;
                if (m_verbose) std::cout << "SchmittTrigger: Falling low "  << std::endl;
            }
            else
            {
                // wait for timer
                m_timer += (currentTime - m_previousTime);
                if (m_verbose) std::cout << "SchmittTrigger: I'm high and waiting "  << std::endl;
            }
        }
        else
        {
            // stable high - reset timer
            m_timer = 0;
            if (m_verbose) std::cout << "SchmittTrigger: Stable high "  << std::endl;
        }
    }
    m_previousTime = currentTime;
}